

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::Initialize(void)

{
  int *piVar1;
  ImGuiViewportP **ppIVar2;
  char *pcVar3;
  ImGuiContext *pIVar4;
  int n;
  ImGuiID IVar5;
  int iVar6;
  ImGuiViewportP *pIVar7;
  ImGuiViewportP **__dest;
  char *__dest_00;
  long lVar8;
  int iVar9;
  int iVar10;
  ImGuiSettingsHandler local_68;
  
  pIVar4 = GImGui;
  if ((GImGui->Initialized == false) && (GImGui->SettingsLoaded != true)) {
    local_68.WriteAllFn =
         (_func_void_ImGuiContext_ptr_ImGuiSettingsHandler_ptr_ImGuiTextBuffer_ptr *)0x0;
    local_68.UserData = (void *)0x0;
    local_68.ReadLineFn =
         (_func_void_ImGuiContext_ptr_ImGuiSettingsHandler_ptr_void_ptr_char_ptr *)0x0;
    local_68.ApplyAllFn = (_func_void_ImGuiContext_ptr_ImGuiSettingsHandler_ptr *)0x0;
    local_68.ReadInitFn = (_func_void_ImGuiContext_ptr_ImGuiSettingsHandler_ptr *)0x0;
    local_68.ReadOpenFn = (_func_void_ptr_ImGuiContext_ptr_ImGuiSettingsHandler_ptr_char_ptr *)0x0;
    local_68.TypeHash = 0;
    local_68._12_4_ = 0;
    local_68.ClearAllFn = (_func_void_ImGuiContext_ptr_ImGuiSettingsHandler_ptr *)0x0;
    local_68.TypeName = "Window";
    IVar5 = ImHashStr("Window",0,0);
    local_68.TypeHash = IVar5;
    local_68.ClearAllFn = WindowSettingsHandler_ClearAll;
    local_68.ReadOpenFn = WindowSettingsHandler_ReadOpen;
    local_68.ReadLineFn = WindowSettingsHandler_ReadLine;
    local_68.ApplyAllFn = WindowSettingsHandler_ApplyAll;
    local_68.WriteAllFn = WindowSettingsHandler_WriteAll;
    AddSettingsHandler(&local_68);
    TableSettingsAddSettingsHandler();
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + 1;
    }
    pIVar7 = (ImGuiViewportP *)(*GImAllocatorAllocFunc)(0xb8,GImAllocatorUserData);
    (pIVar7->super_ImGuiViewport).Flags = 0;
    (pIVar7->super_ImGuiViewport).Pos.x = 0.0;
    *(undefined8 *)&(pIVar7->super_ImGuiViewport).Pos.y = 0;
    *(undefined8 *)&(pIVar7->super_ImGuiViewport).Size.y = 0;
    *(undefined8 *)&(pIVar7->super_ImGuiViewport).WorkPos.y = 0;
    *(undefined8 *)&(pIVar7->super_ImGuiViewport).WorkSize.y = 0;
    (pIVar7->super_ImGuiViewport).PlatformHandleRaw = (void *)0x0;
    (pIVar7->DrawDataP).Valid = false;
    *(undefined3 *)&(pIVar7->DrawDataP).field_0x1 = 0;
    (pIVar7->DrawDataP).CmdListsCount = 0;
    (pIVar7->DrawDataP).TotalIdxCount = 0;
    (pIVar7->DrawDataP).TotalVtxCount = 0;
    (pIVar7->DrawDataP).CmdLists = (ImDrawList **)0x0;
    (pIVar7->DrawDataP).DisplayPos.x = 0.0;
    (pIVar7->DrawDataP).DisplayPos.y = 0.0;
    (pIVar7->DrawDataP).DisplaySize.x = 0.0;
    (pIVar7->DrawDataP).DisplaySize.y = 0.0;
    (pIVar7->DrawDataP).FramebufferScale.x = 0.0;
    (pIVar7->DrawDataP).FramebufferScale.y = 0.0;
    (pIVar7->DrawDataBuilder).Layers[0].Size = 0;
    (pIVar7->DrawDataBuilder).Layers[0].Capacity = 0;
    (pIVar7->DrawDataBuilder).Layers[0].Data = (ImDrawList **)0x0;
    (pIVar7->DrawDataBuilder).Layers[1].Size = 0;
    (pIVar7->DrawDataBuilder).Layers[1].Capacity = 0;
    (pIVar7->DrawDataBuilder).Layers[1].Data = (ImDrawList **)0x0;
    (pIVar7->WorkOffsetMin).x = 0.0;
    (pIVar7->WorkOffsetMin).y = 0.0;
    (pIVar7->WorkOffsetMax).x = 0.0;
    (pIVar7->WorkOffsetMax).y = 0.0;
    (pIVar7->BuildWorkOffsetMin).x = 0.0;
    (pIVar7->BuildWorkOffsetMin).y = 0.0;
    (pIVar7->BuildWorkOffsetMax).x = 0.0;
    (pIVar7->BuildWorkOffsetMax).y = 0.0;
    pIVar7->DrawListsLastFrame[0] = -1;
    pIVar7->DrawListsLastFrame[1] = -1;
    pIVar7->DrawLists[0] = (ImDrawList *)0x0;
    pIVar7->DrawLists[1] = (ImDrawList *)0x0;
    iVar6 = (pIVar4->Viewports).Size;
    if (iVar6 == (pIVar4->Viewports).Capacity) {
      if (iVar6 == 0) {
        iVar9 = 8;
      }
      else {
        iVar9 = iVar6 / 2 + iVar6;
      }
      iVar10 = iVar6 + 1;
      if (iVar6 + 1 < iVar9) {
        iVar10 = iVar9;
      }
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + 1;
      }
      __dest = (ImGuiViewportP **)(*GImAllocatorAllocFunc)((long)iVar10 << 3,GImAllocatorUserData);
      ppIVar2 = (pIVar4->Viewports).Data;
      if (ppIVar2 != (ImGuiViewportP **)0x0) {
        memcpy(__dest,ppIVar2,(long)(pIVar4->Viewports).Size << 3);
        ppIVar2 = (pIVar4->Viewports).Data;
        if ((ppIVar2 != (ImGuiViewportP **)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(ppIVar2,GImAllocatorUserData);
      }
      (pIVar4->Viewports).Data = __dest;
      (pIVar4->Viewports).Capacity = iVar10;
      iVar6 = (pIVar4->Viewports).Size;
    }
    else {
      __dest = (pIVar4->Viewports).Data;
    }
    __dest[iVar6] = pIVar7;
    (pIVar4->Viewports).Size = (pIVar4->Viewports).Size + 1;
    iVar6 = (pIVar4->TempBuffer).Capacity;
    if (iVar6 < 0xc01) {
      if (iVar6 == 0) {
        iVar6 = 8;
      }
      else {
        iVar6 = iVar6 / 2 + iVar6;
      }
      iVar9 = 0xc01;
      if (0xc01 < iVar6) {
        iVar9 = iVar6;
      }
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + 1;
      }
      __dest_00 = (char *)(*GImAllocatorAllocFunc)((size_t)iVar9,GImAllocatorUserData);
      pcVar3 = (pIVar4->TempBuffer).Data;
      if (pcVar3 != (char *)0x0) {
        memcpy(__dest_00,pcVar3,(long)(pIVar4->TempBuffer).Size);
        pcVar3 = (pIVar4->TempBuffer).Data;
        if ((pcVar3 != (char *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(pcVar3,GImAllocatorUserData);
      }
      (pIVar4->TempBuffer).Data = __dest_00;
      (pIVar4->TempBuffer).Capacity = iVar9;
    }
    lVar8 = (long)(pIVar4->TempBuffer).Size;
    if (lVar8 < 0xc01) {
      do {
        (pIVar4->TempBuffer).Data[lVar8] = '\0';
        lVar8 = lVar8 + 1;
      } while (lVar8 != 0xc01);
    }
    (pIVar4->TempBuffer).Size = 0xc01;
    pIVar4->Initialized = true;
    return;
  }
  __assert_fail("!g.Initialized && !g.SettingsLoaded",
                "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/imgui-src/imgui.cpp"
                ,0x1195,"void ImGui::Initialize()");
}

Assistant:

void ImGui::Initialize()
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(!g.Initialized && !g.SettingsLoaded);

    // Add .ini handle for ImGuiWindow type
    {
        ImGuiSettingsHandler ini_handler;
        ini_handler.TypeName = "Window";
        ini_handler.TypeHash = ImHashStr("Window");
        ini_handler.ClearAllFn = WindowSettingsHandler_ClearAll;
        ini_handler.ReadOpenFn = WindowSettingsHandler_ReadOpen;
        ini_handler.ReadLineFn = WindowSettingsHandler_ReadLine;
        ini_handler.ApplyAllFn = WindowSettingsHandler_ApplyAll;
        ini_handler.WriteAllFn = WindowSettingsHandler_WriteAll;
        AddSettingsHandler(&ini_handler);
    }

    // Add .ini handle for ImGuiTable type
    TableSettingsAddSettingsHandler();

    // Create default viewport
    ImGuiViewportP* viewport = IM_NEW(ImGuiViewportP)();
    g.Viewports.push_back(viewport);
    g.TempBuffer.resize(1024 * 3 + 1, 0);

#ifdef IMGUI_HAS_DOCK
#endif

    g.Initialized = true;
}